

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_per_branch(CPUS390XState_conflict *env,uint64_t from,uint64_t to)

{
  _Bool _Var1;
  byte bVar2;
  uint64_t to_local;
  uint64_t from_local;
  CPUS390XState_conflict *env_local;
  
  if (((env->cregs[9] & 0x80000000) != 0) &&
     (((env->cregs[9] & 0x800000) == 0 || (_Var1 = get_per_in_range(env,to), _Var1)))) {
    env->per_address = from;
    bVar2 = get_per_atmid(env);
    env->per_perc_atmid = bVar2 | 0x8000;
  }
  return;
}

Assistant:

void HELPER(per_branch)(CPUS390XState *env, uint64_t from, uint64_t to)
{
    if ((env->cregs[9] & PER_CR9_EVENT_BRANCH)) {
        if (!(env->cregs[9] & PER_CR9_CONTROL_BRANCH_ADDRESS)
            || get_per_in_range(env, to)) {
            env->per_address = from;
            env->per_perc_atmid = PER_CODE_EVENT_BRANCH | get_per_atmid(env);
        }
    }
}